

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall cmServerBase::OnDisconnect(cmServerBase *this,cmConnection *pConnection)

{
  bool bVar1;
  size_t in_RCX;
  void *__buf;
  int __fd;
  vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
  *this_00;
  int in_R8D;
  __normal_iterator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_*,_std::vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>_>
  local_78;
  const_iterator local_70;
  bool local_58;
  undefined7 uStack_57;
  unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *local_50;
  __normal_iterator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_*,_std::vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>_>
  local_48;
  __normal_iterator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_*,_std::vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>_>
  local_40;
  const_iterator local_38;
  undefined1 local_30 [8];
  unique_lock<cm::shared_mutex> lock;
  anon_class_8_1_7e3579ce_for__M_pred pred;
  cmConnection *pConnection_local;
  cmServerBase *this_local;
  
  lock._8_8_ = pConnection;
  std::unique_lock<cm::shared_mutex>::unique_lock
            ((unique_lock<cm::shared_mutex> *)local_30,&this->ConnectionsMutex);
  this_00 = &this->Connections;
  local_48._M_current =
       (unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *)
       std::
       vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
       ::begin(this_00);
  local_50 = (unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *)
             std::
             vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
             ::end(this_00);
  local_58 = lock._M_owns;
  uStack_57 = lock._9_7_;
  local_40 = std::
             remove_if<__gnu_cxx::__normal_iterator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>*,std::vector<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>,std::allocator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>>>>,cmServerBase::OnDisconnect(cmConnection*)::__0>
                       (local_48,(__normal_iterator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_*,_std::vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>_>
                                  )local_50,(anon_class_8_1_7e3579ce_for__M_pred)lock._8_8_);
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>const*,std::vector<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>,std::allocator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>>>>
  ::__normal_iterator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>*>
            ((__normal_iterator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>const*,std::vector<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>,std::allocator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>>>>
              *)&local_38,&local_40);
  local_78._M_current =
       (unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *)
       std::
       vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
       ::end(&this->Connections);
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>const*,std::vector<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>,std::allocator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>>>>
  ::__normal_iterator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>*>
            ((__normal_iterator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>const*,std::vector<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>,std::allocator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>>>>
              *)&local_70,&local_78);
  std::
  vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
  ::erase(this_00,local_38,local_70);
  __fd = (int)local_38._M_current;
  std::unique_lock<cm::shared_mutex>::~unique_lock((unique_lock<cm::shared_mutex> *)local_30);
  bVar1 = std::
          vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
          ::empty(&this->Connections);
  if (bVar1) {
    ::cm::uv_async_ptr::send(&this->ShutdownSignal,__fd,__buf,in_RCX,in_R8D);
  }
  return;
}

Assistant:

void cmServerBase::OnDisconnect(cmConnection* pConnection)
{
  auto pred = [pConnection](const std::unique_ptr<cmConnection>& m) {
    return m.get() == pConnection;
  };
  {
    std::unique_lock<cm::shared_mutex> lock(ConnectionsMutex);
    Connections.erase(
      std::remove_if(Connections.begin(), Connections.end(), pred),
      Connections.end());
  }

  if (Connections.empty()) {
    this->ShutdownSignal.send();
  }
}